

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.cpp
# Opt level: O1

void __thiscall merlin::cte::update(cte *this)

{
  int iVar1;
  edge *peVar2;
  double *pdVar3;
  pointer piVar4;
  pointer ppeVar5;
  long lVar6;
  pointer pnVar7;
  ulong uVar8;
  factor *this_00;
  double dVar9;
  variable VX;
  variable local_d8;
  variable_set local_c8;
  factor local_90;
  
  pnVar7 = (this->m_clusters).
           super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_clusters).
      super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>._M_impl.
      super__Vector_impl_data._M_finish != pnVar7) {
    uVar8 = 0;
    do {
      this_00 = &pnVar7[uVar8].belief;
      factor::operator=(this_00,&pnVar7[uVar8].theta);
      ppeVar5 = pnVar7[uVar8].edges.
                super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppeVar5 !=
          pnVar7[uVar8].edges.
          super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pnVar7 = pnVar7 + uVar8;
        do {
          peVar2 = *ppeVar5;
          if (peVar2->second->id == pnVar7->id) {
            factor::binaryOpIP<merlin::factor::binOpTimes>(this_00,&peVar2->fwd);
          }
          if (peVar2->first->id == pnVar7->id) {
            factor::binaryOpIP<merlin::factor::binOpTimes>(this_00,&peVar2->bwd);
          }
          ppeVar5 = ppeVar5 + 1;
        } while (ppeVar5 !=
                 (pnVar7->edges).
                 super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      uVar8 = uVar8 + 1;
      pnVar7 = (this->m_clusters).
               super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)(((long)(this->m_clusters).
                                    super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar7 >> 3)
                            * -0x7d05f417d05f417d));
  }
  dVar9 = 0.0;
  for (pdVar3 = (this->m_root->belief).t_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pdVar3 != (this->m_root->belief).t_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
    dVar9 = dVar9 + *pdVar3;
  }
  dVar9 = log(dVar9);
  this->m_logz = dVar9;
  piVar4 = (this->m_var2clique).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_var2clique).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar4) {
    lVar6 = 0;
    uVar8 = 0;
    do {
      iVar1 = piVar4[uVar8];
      dVar9 = (this->m_gmo).m_dims.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8];
      local_d8.m_states = (size_t)dVar9;
      pnVar7 = (this->m_clusters).
               super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_d8.m_states =
           (long)(dVar9 - 9.223372036854776e+18) & (long)local_d8.m_states >> 0x3f |
           local_d8.m_states;
      local_d8.m_label = uVar8;
      variable_set::variable_set(&local_c8,&local_d8);
      factor::marginal(&local_90,&pnVar7[iVar1].belief,&local_c8);
      factor::operator=((factor *)
                        ((long)&((this->m_beliefs).
                                 super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar6),
                        &local_90);
      factor::~factor(&local_90);
      variable_set::~variable_set(&local_c8);
      factor::normalize((factor *)
                        ((long)&((this->m_beliefs).
                                 super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar6));
      uVar8 = uVar8 + 1;
      piVar4 = (this->m_var2clique).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x60;
    } while (uVar8 < (ulong)((long)(this->m_var2clique).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar4 >> 2));
  }
  return;
}

Assistant:

void cte::update() {

	// Compute the clique beliefs
	for (size_t i = 0; i < m_clusters.size(); ++i) {
		detail::node& cl = m_clusters[i];
		cl.belief = cl.theta;
		for (std::vector<detail::edge*>::iterator ei = cl.edges.begin();
				ei != cl.edges.end(); ++ei) {
			detail::edge* e = (*ei);
			if (e->second->id == cl.id) {
				cl.belief *= e->fwd;
			}
			if (e->first->id == cl.id) {
				cl.belief *= e->bwd;
			}
		}
	}

	// Compute the log partition function
	m_logz = std::log(m_root->belief.sum());

	// Compute the marginals
	for (size_t v = 0; v < m_var2clique.size(); ++v) {
		size_t ci = m_var2clique[v];
		detail::node& cl = m_clusters[ci];
		variable VX = m_gmo.var(v);

		m_beliefs[v] = marg(cl.belief, VX);
		m_beliefs[v].normalize(); // normalize
	}
}